

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

Float __thiscall
pbrt::PiecewiseLinearSpectrum::operator()(PiecewiseLinearSpectrum *this,Float lambda)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  sVar1 = (this->lambdas).nStored;
  if (((sVar1 != 0) && (pfVar2 = (this->lambdas).ptr, *pfVar2 <= lambda)) &&
     (lambda <= pfVar2[sVar1 - 1])) {
    uVar5 = sVar1 - 2;
    if ((long)uVar5 < 1) {
      lVar7 = 0;
    }
    else {
      lVar6 = 1;
      uVar9 = uVar5;
      do {
        uVar8 = uVar9 >> 1;
        uVar9 = ~uVar8 + uVar9;
        lVar7 = uVar8 + 1 + lVar6;
        if (lambda < pfVar2[(int)uVar8 + (int)lVar6]) {
          uVar9 = uVar8;
          lVar7 = lVar6;
        }
        lVar6 = lVar7;
      } while (0 < (long)uVar9);
      if (lVar6 - 1U < uVar5) {
        uVar5 = lVar6 - 1U;
      }
      lVar7 = 0;
      if (0 < lVar6) {
        lVar7 = uVar5 << 0x20;
      }
    }
    fVar10 = *(float *)((long)pfVar2 + (lVar7 >> 0x1e));
    lVar6 = lVar7 + 0x100000000 >> 0x1e;
    pfVar3 = (this->values).ptr;
    fVar10 = (lambda - fVar10) / (*(float *)((long)pfVar2 + lVar6) - fVar10);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)((long)pfVar3 + lVar6))),
                             ZEXT416((uint)(1.0 - fVar10)),
                             ZEXT416(*(uint *)((long)pfVar3 + (lVar7 >> 0x1e))));
    return auVar4._0_4_;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    bool empty() const { return size() == 0; }